

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O2

void __thiscall PF_HashTable::PF_HashTable(PF_HashTable *this,int _numBuckets)

{
  PF_HashEntry **ppPVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->numBuckets = _numBuckets;
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < _numBuckets) {
    uVar3 = (ulong)(uint)_numBuckets << 3;
  }
  uVar2 = (ulong)(uint)_numBuckets;
  if (_numBuckets < 1) {
    uVar2 = uVar4;
  }
  ppPVar1 = (PF_HashEntry **)operator_new__(uVar3);
  this->hashTable = ppPVar1;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    this->hashTable[uVar4] = (PF_HashEntry *)0x0;
  }
  return;
}

Assistant:

PF_HashTable::PF_HashTable(int _numBuckets)
{
  // Initialize numBuckets local variable from parameter
  this->numBuckets = _numBuckets;

  // Allocate memory for hash table
  hashTable = new PF_HashEntry* [numBuckets];

  // Initialize all buckets to empty
  for (int i = 0; i < numBuckets; i++)
    hashTable[i] = NULL;
}